

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,false,false>::runLateOptimizations(wasm::Function*)::EquivalentOptimizer
::visitLocalSet(wasm::LocalSet__(void *this,LocalSet *curr)

{
  bool bVar1;
  Drop *expression;
  Builder local_38;
  LocalGet *local_30;
  LocalGet *get;
  Expression *value;
  Module *module;
  LocalSet *curr_local;
  EquivalentOptimizer *this_local;
  
  module = (Module *)curr;
  curr_local = (LocalSet *)this;
  value = (Expression *)
          Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::getModule
                    ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)this)
  ;
  get = (LocalGet *)
        Properties::getFallthrough
                  ((Expression *)
                   (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(PassOptions *)((long)this + 0xf0),
                   (Module *)value,AllowTeeBrIf);
  local_30 = Expression::dynCast<wasm::LocalGet>((Expression *)get);
  if (local_30 == (LocalGet *)0x0) {
    EquivalentSets::reset
              ((EquivalentSets *)((long)this + 0x1b0),
               *(Index *)&(module->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    bVar1 = EquivalentSets::check
                      ((EquivalentSets *)((long)this + 0x1b0),
                       *(Index *)&(module->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_30->index
                      );
    if (bVar1) {
      if ((*(byte *)((long)this + 0xe8) & 1) != 0) {
        bVar1 = LocalSet::isTee((LocalSet *)module);
        if (bVar1) {
          bVar1 = wasm::Type::operator!=
                            ((Type *)((module->functions).
                                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1),
                             (Type *)&(module->exports).
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish);
          if (bVar1) {
            *(undefined1 *)((long)this + 0x1a9) = 1;
          }
          Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::replaceCurrent
                    ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)this,
                     (Expression *)
                     (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          Builder::Builder(&local_38,(Module *)value);
          expression = Builder::makeDrop(&local_38,
                                         (Expression *)
                                         (module->functions).
                                         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::replaceCurrent
                    ((Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> *)this,
                     (Expression *)expression);
        }
        *(undefined1 *)((long)this + 0x1a8) = 1;
      }
    }
    else {
      EquivalentSets::reset
                ((EquivalentSets *)((long)this + 0x1b0),
                 *(Index *)&(module->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      EquivalentSets::add((EquivalentSets *)((long)this + 0x1b0),
                          *(Index *)&(module->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          local_30->index);
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto* module = this->getModule();

        // Remove trivial copies, even through a tee
        auto* value =
          Properties::getFallthrough(curr->value, passOptions, *module);
        if (auto* get = value->template dynCast<LocalGet>()) {
          if (equivalences.check(curr->index, get->index)) {
            // This is an unnecessary copy!
            if (removeEquivalentSets) {
              if (curr->isTee()) {
                if (curr->value->type != curr->type) {
                  refinalize = true;
                }
                this->replaceCurrent(curr->value);
              } else {
                this->replaceCurrent(Builder(*module).makeDrop(curr->value));
              }
              anotherCycle = true;
            }
            // Nothing more to do, ignore the copy.
            return;
          } else {
            // There is a new equivalence now. Remove all the old ones, and add
            // the new one.
            equivalences.reset(curr->index);
            equivalences.add(curr->index, get->index);
            return;
          }
        }
        // A new value of some kind is assigned here, and it's not something we
        // could handle earlier, so remove all the old equivalent ones.
        equivalences.reset(curr->index);
      }